

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_reduce.cpp
# Opt level: O0

void binary_transform_reduce_sum<tf::RandomPartitioner<tf::DefaultClosureWrapper>>(uint W)

{
  code *pcVar1;
  double dVar2;
  byte extraout_AL;
  FlowBuilder *pFVar3;
  undefined1 *__stat_loc;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  Expression_lhs<const_int_&> EVar4;
  ResultBuilder DOCTEST_RB;
  Task ptask;
  Task stask;
  iterator end2;
  iterator beg2;
  iterator end1;
  iterator beg1;
  int sol;
  int sum;
  size_t c;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<int> *__range2;
  size_t n;
  vector<Data,_std::allocator<Data>_> vec2;
  vector<Data,_std::allocator<Data>_> vec1;
  Taskflow taskflow;
  Executor executor;
  Result *in_stack_fffffffffffffb38;
  Task *tasks;
  undefined4 in_stack_fffffffffffffb40;
  undefined4 in_stack_fffffffffffffb44;
  Executor *this;
  int line;
  allocator_type *in_stack_fffffffffffffb50;
  undefined4 in_stack_fffffffffffffb58;
  Enum in_stack_fffffffffffffb5c;
  Taskflow *in_stack_fffffffffffffb60;
  Executor *in_stack_fffffffffffffb70;
  anon_class_64_8_98fd1da9 *c_00;
  FlowBuilder *this_00;
  int *in_stack_fffffffffffffbc0;
  undefined8 in_stack_fffffffffffffc28;
  undefined8 in_stack_fffffffffffffc30;
  undefined8 in_stack_fffffffffffffc38;
  __basic_future<void> local_390 [2];
  undefined4 local_370;
  undefined4 uStack_36c;
  undefined4 uStack_368;
  undefined4 uStack_364;
  Executor *local_360;
  __normal_iterator<Data_*,_std::vector<Data,_std::allocator<Data>_>_> *local_350;
  __normal_iterator<Data_*,_std::vector<Data,_std::allocator<Data>_>_> *local_348;
  __normal_iterator<Data_*,_std::vector<Data,_std::allocator<Data>_>_> *local_340;
  FlowBuilder local_338;
  Task local_330;
  Data **local_328;
  Executor *local_320;
  Data **local_318;
  FlowBuilder **local_310;
  Data **local_308;
  undefined1 *local_300;
  Data **local_2f8;
  undefined4 *local_2f0;
  Data *local_2e0;
  Data *local_2d8;
  Data *local_2d0;
  Data *local_2c8;
  undefined4 local_2c0;
  undefined4 local_2bc;
  long local_2b8;
  int *local_2b0;
  int *local_2a8;
  int local_29c [5];
  initializer_list<int> local_288;
  initializer_list<int> *local_278;
  FlowBuilder *local_270 [2];
  undefined1 local_260 [32];
  undefined1 local_240 [256];
  undefined1 local_140 [320];
  
  std::shared_ptr<tf::WorkerInterface>::shared_ptr
            ((shared_ptr<tf::WorkerInterface> *)
             CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),in_stack_fffffffffffffb38
            );
  tf::Executor::Executor
            ((Executor *)in_stack_fffffffffffffc38,in_stack_fffffffffffffc30,
             (shared_ptr<tf::WorkerInterface> *)in_stack_fffffffffffffc28);
  std::shared_ptr<tf::WorkerInterface>::~shared_ptr((shared_ptr<tf::WorkerInterface> *)0x1e3b56);
  tf::Taskflow::Taskflow(in_stack_fffffffffffffb60);
  std::allocator<Data>::allocator((allocator<Data> *)0x1e3b77);
  std::vector<Data,_std::allocator<Data>_>::vector
            ((vector<Data,_std::allocator<Data>_> *)in_stack_fffffffffffffb60,
             CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),in_stack_fffffffffffffb50
            );
  std::allocator<Data>::~allocator((allocator<Data> *)0x1e3b9d);
  std::allocator<Data>::allocator((allocator<Data> *)0x1e3baf);
  std::vector<Data,_std::allocator<Data>_>::vector
            ((vector<Data,_std::allocator<Data>_> *)in_stack_fffffffffffffb60,
             CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),in_stack_fffffffffffffb50
            );
  std::allocator<Data>::~allocator((allocator<Data> *)0x1e3bd5);
  local_270[0] = (FlowBuilder *)0x1;
  do {
    this_00 = local_270[0];
    pFVar3 = (FlowBuilder *)
             std::vector<Data,_std::allocator<Data>_>::size
                       ((vector<Data,_std::allocator<Data>_> *)local_240);
    if (pFVar3 <= this_00) {
      std::vector<Data,_std::allocator<Data>_>::~vector
                ((vector<Data,_std::allocator<Data>_> *)in_stack_fffffffffffffb50);
      std::vector<Data,_std::allocator<Data>_>::~vector
                ((vector<Data,_std::allocator<Data>_> *)in_stack_fffffffffffffb50);
      tf::Taskflow::~Taskflow
                ((Taskflow *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
      tf::Executor::~Executor(in_stack_fffffffffffffb70);
      return;
    }
    local_29c[0] = 0;
    local_29c[1] = 1;
    local_29c[2] = 3;
    local_29c[3] = 7;
    local_29c[4] = 99;
    local_288._M_array = local_29c;
    local_288._M_len = 5;
    local_278 = &local_288;
    local_2a8 = std::initializer_list<int>::begin(local_278);
    local_2b0 = std::initializer_list<int>::end
                          ((initializer_list<int> *)
                           CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
    for (; local_2a8 != local_2b0; local_2a8 = local_2a8 + 1) {
      local_2b8 = (long)*local_2a8;
      local_2bc = 100;
      local_2c0 = 100;
      in_stack_fffffffffffffb70 = (Executor *)local_240;
      local_2c8 = (Data *)std::vector<Data,_std::allocator<Data>_>::end
                                    ((vector<Data,_std::allocator<Data>_> *)
                                     in_stack_fffffffffffffb38);
      local_2d0 = (Data *)std::vector<Data,_std::allocator<Data>_>::end
                                    ((vector<Data,_std::allocator<Data>_> *)
                                     in_stack_fffffffffffffb38);
      local_2d8 = (Data *)std::vector<Data,_std::allocator<Data>_>::end
                                    ((vector<Data,_std::allocator<Data>_> *)
                                     in_stack_fffffffffffffb38);
      local_2e0 = (Data *)std::vector<Data,_std::allocator<Data>_>::end
                                    ((vector<Data,_std::allocator<Data>_> *)
                                     in_stack_fffffffffffffb38);
      c_00 = (anon_class_64_8_98fd1da9 *)(local_240 + 0x18);
      tf::Taskflow::clear((Taskflow *)0x1e3d36);
      local_328 = &local_2c8;
      local_318 = &local_2d0;
      local_310 = local_270;
      local_308 = &local_2d8;
      local_2f8 = &local_2e0;
      local_2f0 = &local_2bc;
      local_320 = in_stack_fffffffffffffb70;
      local_300 = local_260;
      tf::FlowBuilder::
      emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_reduce_cpp:1339:37),_nullptr>
                (this_00,c_00);
      tf::Task::Task(&local_330);
      local_340 = (__normal_iterator<Data_*,_std::vector<Data,_std::allocator<Data>_>_> *)
                  std::
                  ref<__gnu_cxx::__normal_iterator<Data*,std::vector<Data,std::allocator<Data>>>>
                            ((__normal_iterator<Data_*,_std::vector<Data,_std::allocator<Data>_>_> *
                             )in_stack_fffffffffffffb38);
      local_348 = (__normal_iterator<Data_*,_std::vector<Data,_std::allocator<Data>_>_> *)
                  std::
                  ref<__gnu_cxx::__normal_iterator<Data*,std::vector<Data,std::allocator<Data>>>>
                            ((__normal_iterator<Data_*,_std::vector<Data,_std::allocator<Data>_>_> *
                             )in_stack_fffffffffffffb38);
      local_350 = (__normal_iterator<Data_*,_std::vector<Data,_std::allocator<Data>_>_> *)
                  std::
                  ref<__gnu_cxx::__normal_iterator<Data*,std::vector<Data,std::allocator<Data>>>>
                            ((__normal_iterator<Data_*,_std::vector<Data,_std::allocator<Data>_>_> *
                             )in_stack_fffffffffffffb38);
      tf::RandomPartitioner<tf::DefaultClosureWrapper>::RandomPartitioner
                ((RandomPartitioner<tf::DefaultClosureWrapper> *)
                 CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                 (size_t)in_stack_fffffffffffffb38);
      tasks = (Task *)CONCAT44(uStack_36c,local_370);
      in_stack_fffffffffffffb40 = uStack_368;
      in_stack_fffffffffffffb44 = uStack_364;
      this = local_360;
      tf::FlowBuilder::
      transform_reduce<std::reference_wrapper<__gnu_cxx::__normal_iterator<Data_*,_std::vector<Data,_std::allocator<Data>_>_>_>,_std::reference_wrapper<__gnu_cxx::__normal_iterator<Data_*,_std::vector<Data,_std::allocator<Data>_>_>_>,_std::reference_wrapper<__gnu_cxx::__normal_iterator<Data_*,_std::vector<Data,_std::allocator<Data>_>_>_>,_int,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_reduce_cpp:1353:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_reduce_cpp:1354:9),_tf::RandomPartitioner<tf::DefaultClosureWrapper>,_nullptr>
                (&local_338,local_240 + 0x18,local_340,local_348,local_350,&local_2c0);
      tf::Task::operator=(&local_330,(Task *)&local_338);
      tf::Task::precede<tf::Task&>
                ((Task *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),tasks);
      __stat_loc = local_140;
      tf::Executor::run(this,(Taskflow *)
                             CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
      line = (int)((ulong)this >> 0x20);
      std::__basic_future<void>::wait(local_390,__stat_loc);
      tf::Future<void>::~Future
                ((Future<void> *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
      in_stack_fffffffffffffb38 = (Result *)0x2150c5;
      doctest::detail::ResultBuilder::ResultBuilder
                ((ResultBuilder *)in_stack_fffffffffffffb60,in_stack_fffffffffffffb5c,
                 (char *)in_stack_fffffffffffffb50,line,
                 (char *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),"",
                 (char *)in_stack_fffffffffffffb70);
      doctest::detail::ExpressionDecomposer::ExpressionDecomposer
                ((ExpressionDecomposer *)&stack0xfffffffffffffbc4,DT_REQUIRE);
      EVar4 = doctest::detail::ExpressionDecomposer::operator<<<int,_nullptr>
                        ((ExpressionDecomposer *)
                         CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                         (int *)in_stack_fffffffffffffb38);
      in_stack_fffffffffffffb60 = (Taskflow *)EVar4.lhs;
      in_stack_fffffffffffffb5c = EVar4.m_at;
      doctest::detail::Expression_lhs<const_int_&>::operator==<int,_nullptr>
                ((Expression_lhs<const_int_&> *)in_stack_fffffffffffffb60,in_stack_fffffffffffffbc0)
      ;
      doctest::detail::ResultBuilder::setResult
                ((ResultBuilder *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40),
                 in_stack_fffffffffffffb38);
      doctest::detail::Result::~Result((Result *)0x1e3fc4);
      dVar2 = doctest::detail::ResultBuilder::log
                        ((ResultBuilder *)&stack0xfffffffffffffbf8,
                         (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
      if ((extraout_AL & 1) != 0) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)(SUB84(dVar2,0));
        return;
      }
      doctest::detail::ResultBuilder::react
                ((ResultBuilder *)CONCAT44(in_stack_fffffffffffffb44,in_stack_fffffffffffffb40));
      doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x1e415e);
    }
    local_270[0] = (FlowBuilder *)((long)&local_270[0]->_graph + 1);
  } while( true );
}

Assistant:

void binary_transform_reduce_sum(unsigned W) {

  tf::Executor executor(W);
  tf::Taskflow taskflow;

  std::vector<Data> vec1(1000);
  std::vector<Data> vec2(1000);

  for(size_t n=1; n<vec1.size(); n++) {
    for(size_t c : {0, 1, 3, 7, 99}) {

      auto sum = 100;
      auto sol = 100;
      auto beg1 = vec1.end();
      auto end1 = vec1.end();
      auto beg2 = vec2.end();
      auto end2 = vec2.end();

      taskflow.clear();
      auto stask = taskflow.emplace([&](){
        beg1 = vec1.begin();
        end1 = vec1.begin() + n;
        beg2 = vec2.begin();
        end2 = vec2.begin() + n;
        for(auto itr1 = beg1, itr2 = beg2; itr1 != end1 && itr2 != end2; itr1++, itr2++) {
          sum += (itr1->get() + itr2->get());
        }
      });

      tf::Task ptask;

      ptask = taskflow.transform_reduce(
        std::ref(beg1), std::ref(end1), std::ref(beg2), sol,
        [] (int l, int r)   { return  l + r; },
        [] (const Data& data1, const Data& data2) { return data1.get() + data2.get(); },
        P(c)
      );

      stask.precede(ptask);

      executor.run(taskflow).wait();

      REQUIRE(sol == sum);
      
    }
  }
}